

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_math.c
# Opt level: O2

double swap_mse(float *im1,float *im2,size_t w,size_t h,size_t X1,size_t Y1,size_t X2,size_t Y2)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  if (w <= X1) {
    X1 = w;
  }
  if (h <= Y1) {
    Y1 = h;
  }
  if (w <= X2) {
    X2 = w;
  }
  if (Y2 < h) {
    h = Y2;
  }
  pfVar1 = im2 + w * Y1;
  pfVar2 = im1 + w * Y1;
  dVar5 = 0.0;
  lVar3 = 0;
  for (; uVar4 = X1, Y1 < h; Y1 = Y1 + 1) {
    for (; uVar4 < X2; uVar4 = uVar4 + 1) {
      lVar3 = lVar3 + 1;
      auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar6._0_8_ = lVar3;
      auVar6._12_4_ = 0x45300000;
      dVar5 = dVar5 + ((double)(pfVar2[uVar4] - pfVar1[uVar4]) *
                       (double)(pfVar2[uVar4] - pfVar1[uVar4]) - dVar5) /
                      ((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
    }
    pfVar1 = pfVar1 + w;
    pfVar2 = pfVar2 + w;
  }
  return dVar5;
}

Assistant:

double swap_mse(const float *im1, const float *im2, size_t w, size_t h,
                size_t X1, size_t Y1, size_t X2, size_t Y2) {
    double d, mse = 0;
    size_t i, j, n = 0;

    X1 = MIN(X1, w), Y1 = MIN(Y1, h), X2 = MIN(X2, w), Y2 = MIN(Y2, h);
    for (j = Y1; j < Y2; ++j)
        for (i = X1; i < X2; ++i) {
            ++n;
            d = im1[j * w + i] - im2[j * w + i];
            mse += (d * d - mse) / n;
        }

    return mse;
}